

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

int encode_ushort_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uint16_t value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uchar local_1a;
  uchar local_19;
  
  local_1a = (uchar)(value >> 8);
  iVar1 = (*encoder_output)(context,&local_1a,1);
  if (iVar1 == 0) {
    local_19 = (uchar)value;
    iVar1 = (*encoder_output)(context,&local_19,1);
    if (iVar1 == 0) {
      return 0;
    }
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
              ,"encode_ushort_value",0x9e4,1,"Failed encoding ushort value");
  }
  return 0x9e5;
}

Assistant:

static int encode_ushort_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, uint16_t value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_276: [<encoding code="0x60" category="fixed" width="2" label="16-bit unsigned integer in network byte order"/>] */
    if ((output_byte(encoder_output, context, (value >> 8) & 0xFF) != 0) ||
        (output_byte(encoder_output, context, (value & 0xFF)) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding ushort value");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}